

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManCollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,Vec_Int_t *vVisit)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vVisit_local;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(ulong *)pObj >> 0x3e & 1) == 0) {
    *(ulong *)pObj = *(ulong *)pObj & 0xbfffffffffffffff | 0x4000000000000000;
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vVisit,iVar1);
    if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x127,
                      "void Emb_ManCollectSuper_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      Emb_ManCollectSuper_rec(p,pGVar2,vSuper,vVisit);
      pGVar2 = Gia_ObjFanin1(pObj);
      Emb_ManCollectSuper_rec(p,pGVar2,vSuper,vVisit);
    }
    else {
      iVar1 = Gia_ObjId(p,pObj);
      Vec_IntPush(vSuper,iVar1);
    }
  }
  return;
}

Assistant:

void Emb_ManCollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, Vec_Int_t * vVisit )  
{
    if ( pObj->fMark1 )
        return;
    pObj->fMark1 = 1;
    Vec_IntPush( vVisit, Gia_ObjId(p, pObj) );
    if ( pObj->fMark0 )
    {
        Vec_IntPush( vSuper, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Emb_ManCollectSuper_rec( p, Gia_ObjFanin0(pObj), vSuper, vVisit );
    Emb_ManCollectSuper_rec( p, Gia_ObjFanin1(pObj), vSuper, vVisit );
    
}